

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_ini>
          (xr_ini_writer *this,undefined8 *container)

{
  way_point_le *pwVar1;
  uint32_t id;
  way_point_le *point;
  write_point_ini local_29;
  
  pwVar1 = (way_point_le *)container[1];
  id = 0;
  for (point = (way_point_le *)*container; point != pwVar1; point = point + 1) {
    write_point_ini::operator()(&local_29,point,this,id);
    id = id + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}